

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O2

void __thiscall features::Surf::keypoint_localization_and_filtering(Surf *this)

{
  undefined8 *puVar1;
  pointer pKVar2;
  bool bVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  undefined1 auStack_58 [8];
  Keypoint kp;
  Keypoints filtered_keypoints;
  
  kp.x = 0.0;
  kp.y = 0.0;
  std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::reserve
            ((vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_> *)&kp.x,
             (long)(this->keypoints).
                   super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->keypoints).
                   super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    pKVar2 = (this->keypoints).
             super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->keypoints).
                      super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar2 >> 4) <= uVar5)
    break;
    puVar1 = (undefined8 *)((long)&pKVar2->octave + lVar4);
    auStack_58 = (undefined1  [8])*puVar1;
    kp._0_8_ = puVar1[1];
    bVar3 = keypoint_localization(this,(Keypoint *)auStack_58);
    if (bVar3) {
      std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::push_back
                ((vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_> *)
                 &kp.x,(Keypoint *)auStack_58);
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  }
  (this->keypoints).
  super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)kp._8_8_;
  (this->keypoints).
  super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keypoints).
  super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  kp._8_8_ = pKVar2;
  std::_Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::
  ~_Vector_base((_Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_> *
                )&kp.x);
  return;
}

Assistant:

void
Surf::keypoint_localization_and_filtering (void)
{
    Keypoints filtered_keypoints;
    filtered_keypoints.reserve(this->keypoints.size());
    for (std::size_t i = 0; i < this->keypoints.size(); ++i)
    {
        Keypoint kp = this->keypoints[i];
        bool solve_good = this->keypoint_localization(&kp);
        if (!solve_good)
            continue;
        filtered_keypoints.push_back(kp);
    }
    std::swap(this->keypoints, filtered_keypoints);
}